

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffTable(NodeDiffComputer *this,TableDecl *lhs,TableDecl *rhs)

{
  TableMember *pTVar1;
  TableMember *pTVar2;
  uint uVar3;
  int32_t iVar4;
  int32_t iVar5;
  int iVar6;
  int32_t i;
  ulong uVar7;
  int32_t iVar8;
  int iVar9;
  long lVar10;
  
  uVar3 = (lhs->_members)._size;
  iVar6 = uVar3 - (rhs->_members)._size;
  if (iVar6 == 0) {
    lVar10 = 0x10;
    iVar8 = 0;
    for (uVar7 = 0; uVar7 < uVar3; uVar7 = uVar7 + 1) {
      pTVar1 = (lhs->_members)._vals;
      pTVar2 = (rhs->_members)._vals;
      iVar4 = diffNodes(this,*(Node **)((long)pTVar1 + lVar10 + -0x10),
                        *(Node **)((long)pTVar2 + lVar10 + -0x10));
      if (this->limit < iVar4) {
        return iVar4;
      }
      iVar5 = diffNodes(this,*(Node **)((long)pTVar1 + lVar10 + -8),
                        *(Node **)((long)pTVar2 + lVar10 + -8));
      if (this->limit < iVar5) {
        return iVar5;
      }
      iVar6 = 0;
      if (((*(byte *)((long)&pTVar1->key + lVar10) ^ *(byte *)((long)&pTVar2->key + lVar10)) & 1) !=
          0) {
        iVar6 = (this->DiffCosts).StaticMemberDiffCost;
      }
      iVar8 = iVar4 + iVar8 + iVar5 + iVar6;
      uVar3 = (lhs->_members)._size;
      lVar10 = lVar10 + 0x18;
    }
  }
  else {
    iVar9 = -iVar6;
    if (0 < iVar6) {
      iVar9 = iVar6;
    }
    iVar8 = iVar9 * (this->DiffCosts).SizeDiffCoeff + (this->DiffCosts).SizeDiffCost;
  }
  return iVar8;
}

Assistant:

int32_t diffTable(const TableDecl *lhs, const TableDecl *rhs) {
    const auto &leftMembers = lhs->members();
    const auto &rightMembers = rhs->members();

    if (leftMembers.size() != rightMembers.size())
      return sizeDiff(leftMembers.size(), rightMembers.size());

    int32_t tableDiff = 0;

    for (int32_t i = 0; i < leftMembers.size(); ++i) {
      const auto &l = leftMembers[i];
      const auto &r = rightMembers[i];

      int32_t keyDiff = diffNodes(l.key, r.key);

      if (keyDiff > limit)
        return keyDiff;

      int32_t valueDiff = diffNodes(l.value, r.value);

      if (valueDiff > limit)
        return valueDiff;

      tableDiff += (keyDiff + valueDiff);

      if (l.isStatic() != r.isStatic())
        tableDiff += DiffCosts.StaticMemberDiffCost;
    }

    return tableDiff;
  }